

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O0

void rcv_thread(int sockfd)

{
  ssize_t sVar1;
  int local_20;
  int local_1c;
  int x;
  int y;
  int mlen;
  int sockfd_local;
  
  pckt = (packet *)malloc(0x406);
  do {
    memset(pckt,0,0x406);
    sVar1 = recv(sockfd,pckt,0x406,0);
    if (((int)sVar1 == -1) || ((int)sVar1 == 0)) {
      perror("Erro ao receber mensagem\n");
      exit_();
    }
    if (typewin == (WINDOW *)0x0) {
      local_1c = -1;
      local_20 = -1;
    }
    else {
      local_1c = (int)typewin->_cury;
      local_20 = (int)typewin->_curx;
    }
    wattr_on(chatwin,((int)pckt->color & 0xffU) << 8,0);
    wprintw(chatwin,"%s: ",pckt);
    wattr_off(chatwin,((int)pckt->color & 0xffU) << 8,0);
    wprintw(chatwin,"%s\n",pckt->msg);
    std::mutex::lock(&mutwin);
    wrefresh(chatwin);
    wrefresh(typewin);
    wmove(typewin,local_1c,local_20);
    std::mutex::unlock(&mutwin);
  } while( true );
}

Assistant:

void rcv_thread(int sockfd) {
  pckt = (struct packet*)malloc(PACKET_LEN);

  while(1) {
    memset(pckt, 0, PACKET_LEN);

    int mlen = recv(sockfd, pckt, PACKET_LEN, 0);
    if(mlen == -1 || mlen == 0) {
      perror("Erro ao receber mensagem\n");
      exit_();
    }
    int y,x;

    getyx(typewin, y, x);


    wattron(chatwin, COLOR_PAIR(pckt->color));
    wprintw(chatwin, "%s: ", pckt->name);
    wattroff(chatwin, COLOR_PAIR(pckt->color));
    wprintw(chatwin, "%s\n", pckt->msg);

    mutwin.lock();
    wrefresh(chatwin);
    wrefresh(typewin);
    wmove(typewin, y,x);
    mutwin.unlock();
  }
}